

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_entropy.c
# Opt level: O0

double * inform_local_block_entropy
                   (int *series,size_t n,size_t m,int b,size_t k,double *be,inform_error *err)

{
  _Bool _Var1;
  ulong uVar2;
  uint32_t *__nmemb;
  int *state_00;
  bool bVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong local_90;
  size_t i;
  double s;
  int *state;
  inform_dist states;
  uint32_t *data;
  size_t states_size;
  _Bool allocate_be;
  size_t N;
  double *be_local;
  size_t k_local;
  int b_local;
  size_t m_local;
  size_t n_local;
  int *series_local;
  
  _Var1 = check_arguments(series,n,m,b,k,err);
  if (_Var1) {
    series_local = (int *)0x0;
  }
  else {
    uVar2 = n * ((m - k) + 1);
    bVar3 = be == (double *)0x0;
    N = (size_t)be;
    if ((bVar3) && (N = (size_t)malloc(uVar2 * 8), (void *)N == (void *)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      series_local = (int *)0x0;
    }
    else {
      auVar5._8_4_ = (int)(k >> 0x20);
      auVar5._0_8_ = k;
      auVar5._12_4_ = 0x45300000;
      dVar4 = pow((double)b,
                  (auVar5._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
      __nmemb = (uint32_t *)
                ((long)dVar4 | (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f);
      state = (int *)calloc((size_t)__nmemb,4);
      states.counts = (uint64_t)state;
      if (state == (int *)0x0) {
        if (bVar3) {
          free((void *)N);
        }
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
        series_local = (int *)0x0;
      }
      else {
        states.histogram = __nmemb;
        states.size = uVar2;
        state_00 = (int *)malloc(uVar2 * 4);
        if (state_00 == (int *)0x0) {
          if (bVar3) {
            free((void *)N);
          }
          free((void *)states.counts);
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
          series_local = (int *)0x0;
        }
        else {
          accumulate_local_observations(series,n,m,b,k,(inform_dist *)&state,state_00);
          for (local_90 = 0; local_90 < uVar2; local_90 = local_90 + 1) {
            auVar6._8_4_ = (int)(uVar2 >> 0x20);
            auVar6._0_8_ = uVar2;
            auVar6._12_4_ = 0x45300000;
            dVar4 = log2((double)(uint)state[state_00[local_90]] /
                         ((auVar6._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)));
            *(double *)(N + local_90 * 8) = -dVar4;
          }
          free(state_00);
          free((void *)states.counts);
          series_local = (int *)N;
        }
      }
    }
  }
  return (double *)series_local;
}

Assistant:

double *inform_local_block_entropy(int const *series, size_t n, size_t m, int b,
    size_t k, double *be, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NULL;

    size_t const N = n * (m - k + 1);

    bool allocate_be = (be == NULL);
    if (allocate_be)
    {
        be = malloc(N * sizeof(double));
        if (be == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t const states_size = (size_t) pow((double) b, (double) k);

    uint32_t *data = calloc(states_size, sizeof(uint32_t));
    if (data == NULL)
    {
        if (allocate_be) free(be);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist states = { data, states_size, N };

    int *state = malloc(N * sizeof(int));
    if (state == NULL)
    {
        if (allocate_be) free(be);
        free(data);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    accumulate_local_observations(series, n, m, b, k, &states, state);

    double s;
    for (size_t i = 0; i < N; ++i)
    {
        s = states.histogram[state[i]];
        be[i] = -log2(s/N);
    }

    free(state);
    free(data);

    return be;
}